

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::SetPipeline(GLContextState *this,GLPipelineObj *GLPipeline)

{
  bool bVar1;
  GLenum err;
  GLuint GLPipelineHandle;
  string msg;
  uint local_40;
  GLuint local_3c;
  string local_38;
  
  local_3c = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>
                    (&this->m_GLPipelineId,GLPipeline,&local_3c);
  if (bVar1) {
    if ((this->m_Caps).IsProgramPipelineSupported == true) {
      (*__glewBindProgramPipeline)(local_3c);
      local_40 = glGetError();
      if (local_40 == 0) {
        return;
      }
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa1,(char (*) [32])"Failed to bind program pipeline",
                 (char (*) [17])"\nGL Error Code: ",&local_40);
      FormatString<char[6]>(&local_38,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa1);
    }
    else {
      FormatString<char[29]>(&local_38,(char (*) [29])"SetPipeline is not supported");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa5);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void GLContextState::SetPipeline(const GLPipelineObj& GLPipeline)
{
    GLuint GLPipelineHandle = 0;
    if (UpdateBoundObject(m_GLPipelineId, GLPipeline, GLPipelineHandle))
    {
        if (m_Caps.IsProgramPipelineSupported)
        {
            glBindProgramPipeline(GLPipelineHandle);
            DEV_CHECK_GL_ERROR("Failed to bind program pipeline");
        }
        else
        {
            UNSUPPORTED("SetPipeline is not supported");
        }
    }
}